

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O3

void __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchCaseBufferGenerate::initPrograms
          (IndirectDispatchCaseBufferGenerate *this,SourceCollections *programCollection)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  long *plVar3;
  ProgramSources *pPVar4;
  size_type *psVar5;
  pointer pDVar6;
  string computeString;
  ostringstream computeBuffer;
  undefined1 auStack_248 [8];
  IndirectDispatchCaseBufferGenerate *local_240;
  SourceCollections *local_238;
  string local_230;
  long *local_210;
  long local_208;
  long local_200 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  uint local_1d0;
  value_type local_1c8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_238 = programCollection;
  IndirectDispatchCaseBufferUpload::initPrograms
            (&this->super_IndirectDispatchCaseBufferUpload,programCollection);
  local_240 = this;
  __s = glu::getGLSLVersionDeclaration((this->super_IndirectDispatchCaseBufferUpload).m_glslVersion)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_248 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xa0);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x41);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(set = 0, binding = 0, std430) buffer Out\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\thighp uint data[];\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"void writeCmd (uint offset, uvec3 numWorkGroups)\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tdata[offset+0u] = numWorkGroups.x;\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tdata[offset+1u] = numWorkGroups.y;\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tdata[offset+2u] = numWorkGroups.z;\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  pDVar6 = (local_240->super_IndirectDispatchCaseBufferUpload).m_dispatchCommands.
           super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pDVar6 != (local_240->super_IndirectDispatchCaseBufferUpload).m_dispatchCommands.
                super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\twriteCmd(",10);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"u, uvec3(",9);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"u, ",3);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"u, ",3);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"u));\n",5);
      pDVar6 = pDVar6 + 1;
    } while (pDVar6 != (local_240->super_IndirectDispatchCaseBufferUpload).m_dispatchCommands.
                       super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::operator+(&local_1f0,"indirect_dispatch_",
                 &(local_240->super_IndirectDispatchCaseBufferUpload).super_TestCase.super_TestCase.
                  super_TestNode.m_name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_230.field_2._M_allocated_capacity = *psVar5;
    local_230.field_2._8_8_ = plVar3[3];
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar5;
    local_230._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_230._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_238->glslSources,&local_230);
  local_1d0 = 5;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void IndirectDispatchCaseBufferGenerate::initPrograms (vk::SourceCollections& programCollection) const
{
	IndirectDispatchCaseBufferUpload::initPrograms(programCollection);

	const char* const	versionDecl = glu::getGLSLVersionDeclaration(m_glslVersion);

	std::ostringstream computeBuffer;

	// Header
	computeBuffer
		<< versionDecl << "\n"
		<< "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		<< "layout(set = 0, binding = 0, std430) buffer Out\n"
		<< "{\n"
		<< "	highp uint data[];\n"
		<< "};\n"
		<< "void writeCmd (uint offset, uvec3 numWorkGroups)\n"
		<< "{\n"
		<< "	data[offset+0u] = numWorkGroups.x;\n"
		<< "	data[offset+1u] = numWorkGroups.y;\n"
		<< "	data[offset+2u] = numWorkGroups.z;\n"
		<< "}\n"
		<< "void main (void)\n"
		<< "{\n";

	// Dispatch commands
	for (DispatchCommandsVec::const_iterator cmdIter = m_dispatchCommands.begin(); cmdIter != m_dispatchCommands.end(); ++cmdIter)
	{
		const deUint32 offs = (deUint32)(cmdIter->m_offset / sizeof(deUint32));
		DE_ASSERT((size_t)offs * sizeof(deUint32) == (size_t)cmdIter->m_offset);

		computeBuffer
			<< "\twriteCmd(" << offs << "u, uvec3("
			<< cmdIter->m_numWorkGroups.x() << "u, "
			<< cmdIter->m_numWorkGroups.y() << "u, "
			<< cmdIter->m_numWorkGroups.z() << "u));\n";
	}

	// Ending
	computeBuffer << "}\n";

	std::string computeString = computeBuffer.str();

	programCollection.glslSources.add("indirect_dispatch_" + m_name + "_generate") << glu::ComputeSource(computeString);
}